

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O1

errno_t memset_s(void *s,rsize_t smax,int c,rsize_t n)

{
  errno_t eVar1;
  
  if (((smax < n) || (s == (void *)0x0)) || ((long)(n | smax) < 0)) {
    if (-1 < (long)smax && s != (void *)0x0) {
      memset(s,c,smax);
    }
    eVar1 = 0x16;
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  }
  else {
    eVar1 = 0;
    if (n != 0) {
      memset(s,c,n);
      eVar1 = 0;
    }
  }
  return eVar1;
}

Assistant:

errno_t memset_s( void * s, rsize_t smax, int c, rsize_t n )
{
    unsigned char * p = ( unsigned char * ) s;

    if ( s == NULL || smax > RSIZE_MAX || n > RSIZE_MAX || n > smax )
    {
        if ( s != NULL && smax <= RSIZE_MAX )
        {
            memset( s, c, smax );
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    while ( n-- )
    {
        *p++ = ( unsigned char ) c;
    }

    return 0;
}